

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate_stream.cpp
# Opt level: O2

void boost::deflate::inflate_stream_test::testInvalidHeader(IDecompressor *d)

{
  error_code expected;
  error_code expected_00;
  error_code expected_01;
  error_code expected_02;
  error_code expected_03;
  error_code expected_04;
  error_code expected_05;
  error_code expected_06;
  IDecompressor IVar1;
  IDecompressor IVar2;
  IDecompressor local_1c0;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  initializer_list<unsigned_char> *local_1b0;
  error_category *local_1a8;
  initializer_list<unsigned_char> *local_1a0;
  error_category *local_198;
  initializer_list<unsigned_char> *local_190;
  error_category *local_188;
  initializer_list<unsigned_char> *local_180;
  error_category *local_178;
  initializer_list<unsigned_char> *local_170;
  error_category *local_168;
  initializer_list<unsigned_char> *local_160;
  error_category *local_158;
  initializer_list<unsigned_char> *local_150;
  error_category *local_148;
  initializer_list<unsigned_char> *local_140;
  error_category *local_138;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  IVar2._vptr_IDecompressor = (_func_int **)&local_1c0;
  local_1c0._vptr_IDecompressor._0_2_ = 0x14;
  IVar1._vptr_IDecompressor = IVar2._vptr_IDecompressor;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_140,incorrect_header_check,(type *)0x0);
  expected.cat_ = (error_category *)0x1;
  expected._0_8_ = local_138;
  check_abi_cxx11_(&local_50,(inflate_stream_test *)d,(IDecompressor *)&stack0xfffffffffffffe28,
                   local_140,expected,0xf,0xffffffffffffffff,(size_t)IVar1._vptr_IDecompressor);
  std::__cxx11::string::~string((string *)&local_50);
  local_1c0._vptr_IDecompressor._0_2_ = 0x217;
  IVar1._vptr_IDecompressor = IVar2._vptr_IDecompressor;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_150,unknown_compression_method,(type *)0x0);
  expected_00.cat_ = (error_category *)0x1;
  expected_00._0_8_ = local_148;
  check_abi_cxx11_(&local_70,(inflate_stream_test *)d,(IDecompressor *)&stack0xfffffffffffffe28,
                   local_150,expected_00,0xf,0xffffffffffffffff,(size_t)IVar1._vptr_IDecompressor);
  std::__cxx11::string::~string((string *)&local_70);
  local_1c0._vptr_IDecompressor._0_2_ = 0xf8;
  IVar1._vptr_IDecompressor = IVar2._vptr_IDecompressor;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_160,invalid_window_size,(type *)0x0);
  expected_01.cat_ = (error_category *)0x1;
  expected_01._0_8_ = local_158;
  check_abi_cxx11_(&local_90,(inflate_stream_test *)d,(IDecompressor *)&stack0xfffffffffffffe28,
                   local_160,expected_01,10,0xffffffffffffffff,(size_t)IVar1._vptr_IDecompressor);
  std::__cxx11::string::~string((string *)&local_90);
  local_1c0._vptr_IDecompressor._0_2_ = 0x8b1f;
  local_1c0._vptr_IDecompressor._2_2_ = 7;
  IVar1._vptr_IDecompressor = IVar2._vptr_IDecompressor;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_170,unknown_compression_method,(type *)0x0);
  expected_02.cat_ = (error_category *)0x2;
  expected_02._0_8_ = local_168;
  check_abi_cxx11_(&local_b0,(inflate_stream_test *)d,(IDecompressor *)&stack0xfffffffffffffe28,
                   local_170,expected_02,0xf,0xffffffffffffffff,(size_t)IVar1._vptr_IDecompressor);
  std::__cxx11::string::~string((string *)&local_b0);
  local_1c0._vptr_IDecompressor._0_2_ = 0x8b1f;
  local_1c0._vptr_IDecompressor._2_2_ = 0xe008;
  IVar1._vptr_IDecompressor = IVar2._vptr_IDecompressor;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_180,unknown_header_flags,(type *)0x0);
  expected_03.cat_ = (error_category *)0x2;
  expected_03._0_8_ = local_178;
  check_abi_cxx11_(&local_d0,(inflate_stream_test *)d,(IDecompressor *)&stack0xfffffffffffffe28,
                   local_180,expected_03,0xf,0xffffffffffffffff,(size_t)IVar1._vptr_IDecompressor);
  std::__cxx11::string::~string((string *)&local_d0);
  local_1c0._vptr_IDecompressor._0_2_ = 0x8b1f;
  local_1c0._vptr_IDecompressor._2_2_ = 0x208;
  local_1c0._vptr_IDecompressor._4_4_ = 0;
  uStack_1b8 = 0xffff0304;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_190,header_crc_mismatch,(type *)0x0);
  expected_04.cat_ = (error_category *)0x2;
  expected_04._0_8_ = local_188;
  check_abi_cxx11_(&local_f0,(inflate_stream_test *)d,(IDecompressor *)&stack0xfffffffffffffe28,
                   local_190,expected_04,0xf,0xffffffffffffffff,(size_t)IVar2._vptr_IDecompressor);
  std::__cxx11::string::~string((string *)&local_f0);
  IVar2._vptr_IDecompressor = (_func_int **)0x88b1f;
  local_1c0._vptr_IDecompressor._0_2_ = SUB82(&stack0xfffffffffffffe28,0);
  local_1c0._vptr_IDecompressor._2_2_ = (undefined2)((ulong)&stack0xfffffffffffffe28 >> 0x10);
  local_1c0._vptr_IDecompressor._4_4_ = (undefined4)((ulong)&stack0xfffffffffffffe28 >> 0x20);
  uStack_1b8 = 0x14;
  uStack_1b4 = 0;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_1a0,incorrect_data_check,(type *)0x0);
  expected_05.cat_ = (error_category *)0x2;
  expected_05._0_8_ = local_198;
  check_abi_cxx11_(&local_110,(inflate_stream_test *)d,&local_1c0,local_1a0,expected_05,0xf,
                   0xffffffffffffffff,(size_t)IVar2._vptr_IDecompressor);
  std::__cxx11::string::~string((string *)&local_110);
  IVar2._vptr_IDecompressor = (_func_int **)0x88b1f;
  local_1c0._vptr_IDecompressor._0_2_ = SUB82(&stack0xfffffffffffffe28,0);
  local_1c0._vptr_IDecompressor._2_2_ = (undefined2)((ulong)&stack0xfffffffffffffe28 >> 0x10);
  local_1c0._vptr_IDecompressor._4_4_ = (undefined4)((ulong)&stack0xfffffffffffffe28 >> 0x20);
  uStack_1b8 = 0x14;
  uStack_1b4 = 0;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_1b0,incorrect_length_check,(type *)0x0);
  expected_06.cat_ = (error_category *)0x2;
  expected_06._0_8_ = local_1a8;
  check_abi_cxx11_(&local_130,(inflate_stream_test *)d,&local_1c0,local_1b0,expected_06,0xf,
                   0xffffffffffffffff,(size_t)IVar2._vptr_IDecompressor);
  std::__cxx11::string::~string((string *)&local_130);
  return;
}

Assistant:

static
    void testInvalidHeader(IDecompressor& d)
    {
        check(d, {0x14, 0x00}, error::incorrect_header_check, boost::deflate::wrap::zlib);
        check(d, {0x17, 0x02}, error::unknown_compression_method, boost::deflate::wrap::zlib);
        check(d, {0xf8, 0x00}, error::invalid_window_size, boost::deflate::wrap::zlib, 10);
        check(d, {0x1f, 0x8b, 0x07, 0x00}, error::unknown_compression_method, boost::deflate::wrap::gzip);
        check(d, {0x1f, 0x8b, 0x08, 0xe0}, error::unknown_header_flags, boost::deflate::wrap::gzip);
        check(d, {0x1f, 0x8b, 0x08, 0x02, 0x00, 0x00, 0x00, 0x00, 0x04,
                  0x03, 0xff, 0xff}, error::header_crc_mismatch, boost::deflate::wrap::gzip);
        check(d, {0x1f, 0x8b, 0x08, 0x00,
                  0x00, 0x00, 0x00, 0x00, 0x04, 0x03, 0x03, 0x00,
                  0x00, 0x00, 0x00, 0x01, 0x00, 0x00, 0x00, 0x00}, error::incorrect_data_check, boost::deflate::wrap::gzip);
        check(d, {0x1f, 0x8b, 0x08, 0x00,
                  0x00, 0x00, 0x00, 0x00, 0x04, 0x03, 0x03, 0x00,
                  0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01}, error::incorrect_length_check, boost::deflate::wrap::gzip);
    }